

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMapping.c
# Opt level: O3

char * Mips_group_name(csh handle,uint id)

{
  ulong uVar1;
  
  if (id - 2 < 0x7e || 0xa0 < id) {
    return (char *)0x0;
  }
  uVar1 = (ulong)(id - 0x7e);
  if (id < 0x80) {
    uVar1 = (ulong)id;
  }
  return group_name_maps[uVar1].name;
}

Assistant:

const char *Mips_group_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	// verify group id
	if (id >= MIPS_GRP_ENDING || (id > MIPS_GRP_JUMP && id < MIPS_GRP_BITCOUNT))
		return NULL;

	// NOTE: when new generic groups are added, 2 must be changed accordingly
	if (id >= 128)
		return group_name_maps[id - 128 + 2].name;
	else
		return group_name_maps[id].name;
#else
	return NULL;
#endif
}